

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3AlterFinishAddColumn(Parse *pParse,Token *pColDef)

{
  ushort uVar1;
  sqlite3 *db;
  Table *pTVar2;
  Schema *pSVar3;
  Column *pCVar4;
  ExprList *pEVar5;
  sqlite3_value *v;
  byte bVar6;
  int iVar7;
  uint uVar8;
  Table *pTVar9;
  ulong __n;
  byte *__dest;
  byte *pbVar10;
  Vdbe *p;
  Schema **ppSVar11;
  char *pcVar12;
  int p1;
  char *zName;
  char *pcVar13;
  ValueNewStat4Ctx *in_R9;
  long lVar14;
  Expr *pExpr;
  sqlite3_value *pVal;
  Expr *local_70;
  sqlite3_value *local_38;
  
  if (pParse->nErr != 0) {
    return;
  }
  db = pParse->db;
  pTVar2 = pParse->pNewTable;
  if (pTVar2->pSchema == (Schema *)0x0) {
    p1 = -0x8000;
  }
  else {
    p1 = -1;
    ppSVar11 = &db->aDb->pSchema;
    do {
      p1 = p1 + 1;
      pSVar3 = *ppSVar11;
      ppSVar11 = ppSVar11 + 4;
    } while (pSVar3 != pTVar2->pSchema);
  }
  pcVar13 = db->aDb[p1].zDbSName;
  pCVar4 = pTVar2->aCol;
  zName = pTVar2->zName + 0x10;
  lVar14 = (long)pTVar2->nCol;
  uVar1 = pCVar4[lVar14 + -1].iDflt;
  if ((((uVar1 == 0) || (pTVar2->eTabType != '\0')) ||
      (pEVar5 = (pTVar2->u).tab.pDfltList, pEVar5 == (ExprList *)0x0)) ||
     (pEVar5->nExpr < (int)(uint)uVar1)) {
    local_70 = (Expr *)0x0;
  }
  else {
    local_70 = pEVar5->a[uVar1 - 1].pExpr;
  }
  pTVar9 = sqlite3FindTable(db,zName,pcVar13);
  iVar7 = sqlite3AuthCheck(pParse,0x1a,pcVar13,pTVar9->zName,(char *)0x0);
  if (iVar7 != 0) {
    return;
  }
  uVar1 = pCVar4[lVar14 + -1].colFlags;
  if ((uVar1 & 1) != 0) {
    pcVar13 = "Cannot add a PRIMARY KEY column";
LAB_00183d36:
    sqlite3ErrorMsg(pParse,pcVar13);
    return;
  }
  if (pTVar2->pIndex != (Index *)0x0) {
    pcVar13 = "Cannot add a UNIQUE column";
    goto LAB_00183d36;
  }
  if ((uVar1 & 0x60) == 0) {
    if (local_70 == (Expr *)0x0) {
      pExpr = (Expr *)0x0;
    }
    else {
      pExpr = (Expr *)0x0;
      if (local_70->pLeft->op != 'y') {
        pExpr = local_70;
      }
    }
    if ((((db->flags & 0x4000) == 0) || ((pTVar2->u).tab.pFKey == (FKey *)0x0)) ||
       (pExpr == (Expr *)0x0)) {
      if (((pCVar4[lVar14 + -1].field_0x8 & 0xf) != 0) && (pExpr == (Expr *)0x0)) {
        pcVar12 = "Cannot add a NOT NULL column with default value NULL";
        goto LAB_00183db4;
      }
      if (pExpr == (Expr *)0x0) goto LAB_00183dcd;
    }
    else {
      sqlite3NestedParse(pParse,"SELECT raise(ABORT,%Q) FROM \"%w\".\"%w\"",
                         "Cannot add a REFERENCES column with non-NULL default value",pcVar13,zName)
      ;
    }
    local_38 = (sqlite3_value *)0x0;
    iVar7 = valueFromExpr(db,pExpr,'\x01','A',&local_38,in_R9);
    v = local_38;
    if (iVar7 != 0) {
      return;
    }
    if (local_38 == (sqlite3_value *)0x0) {
      sqlite3NestedParse(pParse,"SELECT raise(ABORT,%Q) FROM \"%w\".\"%w\"",
                         "Cannot add a column with non-constant default",pcVar13,zName);
    }
    sqlite3ValueFree(v);
  }
  else {
    if ((uVar1 & 0x40) == 0) goto LAB_00183dcd;
    pcVar12 = "cannot add a STORED column";
LAB_00183db4:
    sqlite3NestedParse(pParse,"SELECT raise(ABORT,%Q) FROM \"%w\".\"%w\"",pcVar12,pcVar13,zName);
  }
LAB_00183dcd:
  pcVar12 = pColDef->z;
  if (pcVar12 != (char *)0x0) {
    __n = (ulong)pColDef->n;
    __dest = (byte *)sqlite3DbMallocRawNN(db,__n + 1);
    if (__dest != (byte *)0x0) {
      memcpy(__dest,pcVar12,__n);
      __dest[__n] = 0;
      uVar8 = pColDef->n - 1;
      if (uVar8 != 0) {
        pbVar10 = __dest + uVar8;
        do {
          if (((ulong)*pbVar10 != 0x3b) && ((""[*pbVar10] & 1) == 0)) break;
          *pbVar10 = 0;
          pbVar10 = pbVar10 + -1;
        } while (__dest < pbVar10);
      }
      uVar8 = (pTVar2->u).tab.addColOffset;
      sqlite3NestedParse(pParse,
                         "UPDATE \"%w\".sqlite_master SET sql = printf(\'%%.%ds, \',sql) || %Q || substr(sql,1+length(printf(\'%%.%ds\',sql))) WHERE type = \'table\' AND name = %Q"
                         ,pcVar13,(ulong)uVar8,__dest,(ulong)uVar8,zName);
      sqlite3DbFreeNN(db,__dest);
    }
  }
  p = sqlite3GetVdbe(pParse);
  if (p != (Vdbe *)0x0) {
    if (pParse->nTempReg == '\0') {
      iVar7 = pParse->nMem + 1;
      pParse->nMem = iVar7;
    }
    else {
      bVar6 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar6;
      iVar7 = pParse->aTempReg[bVar6];
    }
    sqlite3VdbeAddOp3(p,99,p1,iVar7,2);
    sqlite3VdbeUsesBtree(p,p1);
    sqlite3VdbeAddOp3(p,0x56,iVar7,-2,0);
    sqlite3VdbeAddOp3(p,0x3b,iVar7,p->nOp + 2,0);
    sqlite3VdbeAddOp3(p,100,p1,2,3);
    if (iVar7 != 0) {
      bVar6 = pParse->nTempReg;
      if ((ulong)bVar6 < 8) {
        pParse->nTempReg = bVar6 + 1;
        pParse->aTempReg[bVar6] = iVar7;
      }
    }
    renameReloadSchema(pParse,p1,3);
    if ((pTVar2->pCheck != (ExprList *)0x0) ||
       (((pCVar4[lVar14 + -1].field_0x8 & 0xf) != 0 && ((pCVar4[lVar14 + -1].colFlags & 0x60) != 0))
       )) {
      sqlite3NestedParse(pParse,
                         "SELECT CASE WHEN quick_check GLOB \'CHECK*\' THEN raise(ABORT,\'CHECK constraint failed\') ELSE raise(ABORT,\'NOT NULL constraint failed\') END  FROM pragma_quick_check(%Q,%Q) WHERE quick_check GLOB \'CHECK*\' OR quick_check GLOB \'NULL*\'"
                         ,zName,pcVar13);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterFinishAddColumn(Parse *pParse, Token *pColDef){
  Table *pNew;              /* Copy of pParse->pNewTable */
  Table *pTab;              /* Table being altered */
  int iDb;                  /* Database number */
  const char *zDb;          /* Database name */
  const char *zTab;         /* Table name */
  char *zCol;               /* Null-terminated column definition */
  Column *pCol;             /* The new column */
  Expr *pDflt;              /* Default value for the new column */
  sqlite3 *db;              /* The database connection; */
  Vdbe *v;                  /* The prepared statement under construction */
  int r1;                   /* Temporary registers */

  db = pParse->db;
  assert( db->pParse==pParse );
  if( pParse->nErr ) return;
  assert( db->mallocFailed==0 );
  pNew = pParse->pNewTable;
  assert( pNew );

  assert( sqlite3BtreeHoldsAllMutexes(db) );
  iDb = sqlite3SchemaToIndex(db, pNew->pSchema);
  zDb = db->aDb[iDb].zDbSName;
  zTab = &pNew->zName[16];  /* Skip the "sqlite_altertab_" prefix on the name */
  pCol = &pNew->aCol[pNew->nCol-1];
  pDflt = sqlite3ColumnExpr(pNew, pCol);
  pTab = sqlite3FindTable(db, zTab, zDb);
  assert( pTab );

#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Invoke the authorization callback. */
  if( sqlite3AuthCheck(pParse, SQLITE_ALTER_TABLE, zDb, pTab->zName, 0) ){
    return;
  }
#endif


  /* Check that the new column is not specified as PRIMARY KEY or UNIQUE.
  ** If there is a NOT NULL constraint, then the default value for the
  ** column must not be NULL.
  */
  if( pCol->colFlags & COLFLAG_PRIMKEY ){
    sqlite3ErrorMsg(pParse, "Cannot add a PRIMARY KEY column");
    return;
  }
  if( pNew->pIndex ){
    sqlite3ErrorMsg(pParse,
         "Cannot add a UNIQUE column");
    return;
  }
  if( (pCol->colFlags & COLFLAG_GENERATED)==0 ){
    /* If the default value for the new column was specified with a
    ** literal NULL, then set pDflt to 0. This simplifies checking
    ** for an SQL NULL default below.
    */
    assert( pDflt==0 || pDflt->op==TK_SPAN );
    if( pDflt && pDflt->pLeft->op==TK_NULL ){
      pDflt = 0;
    }
    assert( IsOrdinaryTable(pNew) );
    if( (db->flags&SQLITE_ForeignKeys) && pNew->u.tab.pFKey && pDflt ){
      sqlite3ErrorIfNotEmpty(pParse, zDb, zTab,
          "Cannot add a REFERENCES column with non-NULL default value");
    }
    if( pCol->notNull && !pDflt ){
      sqlite3ErrorIfNotEmpty(pParse, zDb, zTab,
          "Cannot add a NOT NULL column with default value NULL");
    }


    /* Ensure the default expression is something that sqlite3ValueFromExpr()
    ** can handle (i.e. not CURRENT_TIME etc.)
    */
    if( pDflt ){
      sqlite3_value *pVal = 0;
      int rc;
      rc = sqlite3ValueFromExpr(db, pDflt, SQLITE_UTF8, SQLITE_AFF_BLOB, &pVal);
      assert( rc==SQLITE_OK || rc==SQLITE_NOMEM );
      if( rc!=SQLITE_OK ){
        assert( db->mallocFailed == 1 );
        return;
      }
      if( !pVal ){
        sqlite3ErrorIfNotEmpty(pParse, zDb, zTab,
           "Cannot add a column with non-constant default");
      }
      sqlite3ValueFree(pVal);
    }
  }else if( pCol->colFlags & COLFLAG_STORED ){
    sqlite3ErrorIfNotEmpty(pParse, zDb, zTab, "cannot add a STORED column");
  }


  /* Modify the CREATE TABLE statement. */
  zCol = sqlite3DbStrNDup(db, (char*)pColDef->z, pColDef->n);
  if( zCol ){
    char *zEnd = &zCol[pColDef->n-1];
    while( zEnd>zCol && (*zEnd==';' || sqlite3Isspace(*zEnd)) ){
      *zEnd-- = '\0';
    }
    /* substr() operations on characters, but addColOffset is in bytes. So we
    ** have to use printf() to translate between these units: */
    assert( IsOrdinaryTable(pTab) );
    assert( IsOrdinaryTable(pNew) );
    sqlite3NestedParse(pParse,
        "UPDATE \"%w\"." LEGACY_SCHEMA_TABLE " SET "
          "sql = printf('%%.%ds, ',sql) || %Q"
          " || substr(sql,1+length(printf('%%.%ds',sql))) "
        "WHERE type = 'table' AND name = %Q",
      zDb, pNew->u.tab.addColOffset, zCol, pNew->u.tab.addColOffset,
      zTab
    );
    sqlite3DbFree(db, zCol);
  }

  v = sqlite3GetVdbe(pParse);
  if( v ){
    /* Make sure the schema version is at least 3.  But do not upgrade
    ** from less than 3 to 4, as that will corrupt any preexisting DESC
    ** index.
    */
    r1 = sqlite3GetTempReg(pParse);
    sqlite3VdbeAddOp3(v, OP_ReadCookie, iDb, r1, BTREE_FILE_FORMAT);
    sqlite3VdbeUsesBtree(v, iDb);
    sqlite3VdbeAddOp2(v, OP_AddImm, r1, -2);
    sqlite3VdbeAddOp2(v, OP_IfPos, r1, sqlite3VdbeCurrentAddr(v)+2);
    VdbeCoverage(v);
    sqlite3VdbeAddOp3(v, OP_SetCookie, iDb, BTREE_FILE_FORMAT, 3);
    sqlite3ReleaseTempReg(pParse, r1);

    /* Reload the table definition */
    renameReloadSchema(pParse, iDb, INITFLAG_AlterAdd);

    /* Verify that constraints are still satisfied */
    if( pNew->pCheck!=0
     || (pCol->notNull && (pCol->colFlags & COLFLAG_GENERATED)!=0)
    ){
      sqlite3NestedParse(pParse,
        "SELECT CASE WHEN quick_check GLOB 'CHECK*'"
        " THEN raise(ABORT,'CHECK constraint failed')"
        " ELSE raise(ABORT,'NOT NULL constraint failed')"
        " END"
        "  FROM pragma_quick_check(%Q,%Q)"
        " WHERE quick_check GLOB 'CHECK*' OR quick_check GLOB 'NULL*'",
        zTab, zDb
      );
    }
  }
}